

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O3

char * __thiscall CDefineTable::Get(CDefineTable *this,char *name)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  CDefineTableEntry *pCVar4;
  
  this->DefArrayList = (CStringsList *)0x0;
  if ((name != (char *)0x0) && (bVar1 = *name, bVar1 != 0)) {
    if (name[1] == '_') {
      iVar2 = strcmp(name,"__COUNTER__");
      if (iVar2 == 0) {
        snprintf(defineGet__Counter__Buffer,0x1e,"%d",(ulong)(uint)PredefinedCounter);
        PredefinedCounter = PredefinedCounter + 1;
        return defineGet__Counter__Buffer;
      }
      iVar2 = strcmp(name,"__LINE__");
      if (iVar2 == 0) {
        if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
            super__Vector_impl_data._M_start ==
            sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar3 = 0;
        }
        else {
          uVar3 = (ulong)sourcePosStack.
                         super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1].line;
        }
        snprintf(defineGet__Line__Buffer,0x1e,"%d",uVar3);
        return defineGet__Line__Buffer;
      }
    }
    pCVar4 = this->defs[bVar1 & 0x7f];
    if (pCVar4 != (CDefineTableEntry *)0x0) {
      do {
        iVar2 = strcmp(name,pCVar4->name);
        if (iVar2 == 0) {
          this->DefArrayList = pCVar4->nss;
          return pCVar4->value;
        }
        pCVar4 = pCVar4->next;
      } while (pCVar4 != (CDefineTableEntry *)0x0);
      return (char *)0x0;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* CDefineTable::Get(const char* name) {
	DefArrayList = nullptr;
	if (nullptr == name || 0 == name[0]) return nullptr;
	// the __COUNTER__ and __LINE__ have fully dynamic custom implementation here
	if ('_' == name[1]) {
		if (!strcmp(name, "__COUNTER__")) {
			SPRINTF1(defineGet__Counter__Buffer, 30, "%d", PredefinedCounter);
			++PredefinedCounter;
			return defineGet__Counter__Buffer;
		}
		if (!strcmp(name, "__LINE__")) {
			SPRINTF1(defineGet__Line__Buffer, 30, "%d", sourcePosStack.empty() ? 0 : sourcePosStack.back().line);
			return defineGet__Line__Buffer;
		}
	}
	CDefineTableEntry* p = defs[(*name)&127];
	while (p && strcmp(name, p->name)) p = p->next;
	if (nullptr == p) return nullptr;
	DefArrayList = p->nss;
	return p->value;
}